

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

cmJSONHelper<int,_cmCMakePresetsGraph::ReadFileResult> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Required<int,std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>>
          (cmJSONHelper<int,_cmCMakePresetsGraph::ReadFileResult> *__return_storage_ptr__,
          cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *this,ReadFileResult fail,
          function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *func)

{
  undefined4 in_register_00000014;
  anon_class_40_2_3f1793ff local_38;
  
  local_38.fail = (ReadFileResult)this;
  std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::function
            (&local_38.func,
             (function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *)
             CONCAT44(in_register_00000014,fail));
  std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Required<int,std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>>(cmCMakePresetsGraph::ReadFileResult,std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>)::_lambda(int&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)> *)
             __return_storage_ptr__,&local_38);
  std::_Function_base::~_Function_base(&local_38.func.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<T, E, CallState...> Required(E fail, F func)
  {
    return [fail, func](T& out, const Json::Value* value,
                        CallState&&... state) -> E {
      if (!value) {
        return fail;
      }
      return func(out, value, std::forward(state)...);
    };
  }